

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O3

int net_ip4_resolve_hostname(char *hostname,unsigned_short port,uchar *ip,sockaddr_in *saddr)

{
  hostent *phVar1;
  int iVar2;
  
  if (hostname != (char *)0x0) {
    phVar1 = gethostbyname(hostname);
    if (phVar1 == (hostent *)0x0) {
      perror("gethostbyname");
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      if (phVar1->h_length == 4) {
        if (ip != (uchar *)0x0) {
          *(undefined4 *)ip = *(undefined4 *)*phVar1->h_addr_list;
        }
        iVar2 = 1;
        if (saddr != (sockaddr_in *)0x0) {
          memcpy(&saddr->sin_addr,*phVar1->h_addr_list,(long)phVar1->h_length);
          saddr->sin_port = port;
        }
      }
    }
    return iVar2;
  }
  __assert_fail("hostname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/network4.c",0x1d,
                "int net_ip4_resolve_hostname(const char *, unsigned short, unsigned char *, struct sockaddr_in *)"
               );
}

Assistant:

int net_ip4_resolve_hostname(const char *hostname,
                             unsigned short port,
                             unsigned char ip[4],
                             struct sockaddr_in *saddr) {
  assert(hostname != NULL);

  struct hostent *host;
  if (NULL == (host = gethostbyname(hostname))) {
    perror("gethostbyname");
    return 0;
  }
  if (host->h_length != 4) {
    return 0;
  }
  if (ip != NULL)
    memcpy(ip, host->h_addr_list[0], host->h_length);
  if (saddr != NULL) {
    memcpy(&saddr->sin_addr, host->h_addr_list[0], host->h_length);
    saddr->sin_port = port;
  }

  return 1;
}